

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::ClockingItemSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ClockingItemSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (ClockingItemSyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 2;
    break;
  case (ClockingItemSyntax *)0x1:
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[5].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (ClockingItemSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 6;
    break;
  case (ClockingItemSyntax *)0x3:
    return __return_storage_ptr__ + 9;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax ClockingItemSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return direction.get();
        case 2: return &decls;
        case 3: return &semi;
        default: return nullptr;
    }
}